

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O3

IDeckLinkAudioOutputCallback *
cdecklink_internal_callback_create_deck_link_audio_output_callback
          (void *ctx,cdecklink_audio_output_callback_render_audio_samples *cb0)

{
  IDeckLinkAudioOutputCallback *pIVar1;
  
  if (cb0 != (cdecklink_audio_output_callback_render_audio_samples *)0x0) {
    pIVar1 = (IDeckLinkAudioOutputCallback *)operator_new(0x20);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108c28;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    return pIVar1;
  }
  return (IDeckLinkAudioOutputCallback *)0x0;
}

Assistant:

IDeckLinkAudioOutputCallback* cdecklink_internal_callback_create_deck_link_audio_output_callback (void *ctx, cdecklink_audio_output_callback_render_audio_samples *cb0) {
	if (cb0 != nullptr) {
		return new DeckLinkAudioOutputCallback(ctx, cb0);
	}
	return nullptr;
}